

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

bool jsonnet::internal::allowed_at_end_of_operator(char c)

{
  undefined3 in_register_00000039;
  uint uVar1;
  
  uVar1 = CONCAT31(in_register_00000039,c);
  if (((0x2d < uVar1) || ((0x281200000000U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) && (uVar1 != 0x7e))
  {
    return true;
  }
  return false;
}

Assistant:

bool allowed_at_end_of_operator(char c) {
    switch (c) {
        case '+':
        case '-':
        case '~':
        case '!':
        case '$': return false;
    }
    return true;
}